

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_uint xmrig::OclLib::getNumPlatforms(void)

{
  cl_int ret_00;
  char *pcVar1;
  cl_int ret;
  cl_uint count;
  cl_platform_id *in_stack_ffffffffffffffe8;
  cl_uint in_stack_fffffffffffffff4;
  
  ret_00 = getPlatformIDs(in_stack_fffffffffffffff4,in_stack_ffffffffffffffe8,(cl_uint *)0x21fc1a);
  if (ret_00 != 0) {
    pcVar1 = OclError::toString(ret_00);
    Log::print(ERR,"Error %s when calling clGetPlatformIDs for number of platforms.",pcVar1);
  }
  Log::print(ERR,"No OpenCL platform found.");
  return 0;
}

Assistant:

cl_uint xmrig::OclLib::getNumPlatforms() noexcept
{
    cl_uint count = 0;
    cl_int ret;

    if ((ret = OclLib::getPlatformIDs(0, nullptr, &count)) != CL_SUCCESS) {
        LOG_ERR("Error %s when calling clGetPlatformIDs for number of platforms.", OclError::toString(ret));
    }

    if (count == 0) {
        LOG_ERR("No OpenCL platform found.");
    }

    return count;
}